

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
boost::ext::di::v1_3_0::core::successful::any_type_ref::operator_cast_to_string
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,any_type_ref *this)

{
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18;
  undefined8 local_17;
  undefined4 local_f;
  undefined2 local_b;
  char local_9;
  
  local_28 = &local_18;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 1) = local_17;
  *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = local_f;
  *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = local_b;
  (__return_storage_ptr__->field_2)._M_local_buf[0xf] = local_9;
  __return_storage_ptr__->_M_string_length = 0;
  local_20 = 0;
  local_18 = 0;
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator T() {
    return static_cast<const core::injector__<TInjector>&>(injector_).create_successful_impl(aux::type<T>{});
  }